

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O0

bool32 rw::d3d::rasterFromImage(Raster *raster,Image *image)

{
  FILE *__stream;
  char *pcVar1;
  bool bVar2;
  uint8 *local_90;
  uint8 *rasrow;
  uint8 *imgrow;
  int y;
  int x;
  uint8 *imgpixels;
  uint8 *pixels;
  int local_60;
  int iStack_5c;
  bool unlock;
  int32 i;
  int pallength;
  uint8 *out;
  uint8 *in;
  undefined4 local_40;
  Error _e;
  int32 format;
  D3dRaster *natras;
  Image *truecolimg;
  _func_void_uint8_ptr_uint8_ptr *conv;
  Image *image_local;
  Raster *raster_local;
  
  if ((raster->type & 0xfU) != 4) {
    return 0;
  }
  natras = (D3dRaster *)0x0;
  conv = (_func_void_uint8_ptr_uint8_ptr *)image;
  if ((image->depth < 9) && (isP8supported == 0)) {
    natras = (D3dRaster *)Image::create(image->width,image->height,image->depth);
    ((Image *)natras)->pixels = image->pixels;
    ((Image *)natras)->stride = image->stride;
    ((Image *)natras)->palette = image->palette;
    Image::unpalettize((Image *)natras,false);
    conv = (_func_void_uint8_ptr_uint8_ptr *)natras;
  }
  register0x00000000 = (long)&raster->platform + (long)nativeRasterOffset;
  _e.plugin = raster->format & 0x6f00;
  switch(*(undefined4 *)(conv + 0xc)) {
  case 4:
    if ((_e.plugin == 0x4500) || (_e.plugin == 0x2500)) {
      truecolimg = (Image *)conv_8_from_8;
      goto LAB_00120560;
    }
    break;
  default:
    break;
  case 8:
    if (_e.plugin == 0x2500) {
      truecolimg = (Image *)conv_8_from_8;
      goto LAB_00120560;
    }
    break;
  case 0x10:
    if (_e.plugin == 0x100) {
      truecolimg = (Image *)conv_ARGB1555_from_ARGB1555;
      goto LAB_00120560;
    }
    break;
  case 0x18:
    if (_e.plugin == 0x500) {
      truecolimg = (Image *)conv_BGRA8888_from_RGB888;
    }
    else {
      if (_e.plugin != 0x600) break;
      truecolimg = (Image *)conv_BGR888_from_RGB888;
    }
    goto LAB_00120560;
  case 0x20:
    if (_e.plugin == 0x500) {
      truecolimg = (Image *)conv_BGRA8888_from_RGBA8888;
    }
    else {
      if (_e.plugin != 0x600) break;
      truecolimg = (Image *)conv_BGR888_from_RGB888;
    }
LAB_00120560:
    iStack_5c = 0;
    if ((raster->format & 0x4000U) == 0) {
      if ((raster->format & 0x2000U) != 0) {
        iStack_5c = 0x100;
      }
    }
    else {
      iStack_5c = 0x10;
    }
    if (iStack_5c != 0) {
      out = *(uint8 **)(conv + 0x20);
      _i = *(uint8 **)(register0x00000000 + 8);
      for (local_60 = 0; local_60 < iStack_5c; local_60 = local_60 + 1) {
        conv_RGBA8888_from_RGBA8888(_i,out);
        out = out + 4;
        _i = _i + 4;
      }
    }
    bVar2 = raster->pixels == (uint8 *)0x0;
    if (bVar2) {
      Raster::lock(raster,0,5);
    }
    imgpixels = raster->pixels;
    for (imgrow._0_4_ = 0; (int)imgrow < *(int *)(conv + 8); imgrow._0_4_ = (int)imgrow + 1) {
      local_90 = imgpixels;
      for (imgrow._4_4_ = 0; imgrow._4_4_ < *(int *)(conv + 4); imgrow._4_4_ = imgrow._4_4_ + 1) {
        (*(code *)truecolimg)(local_90);
        local_90 = local_90 + *(uint *)(stack0xffffffffffffffc8 + 0x1c);
      }
      imgpixels = imgpixels + raster->stride;
    }
    if (bVar2) {
      Raster::unlock(raster,0);
    }
    if (natras != (D3dRaster *)0x0) {
      Image::destroy((Image *)natras);
    }
    return 1;
  }
  fprintf(_stderr,"%d %x\n",(ulong)*(uint *)(conv + 0xc),(ulong)_e.plugin);
  fflush(_stdout);
  in._4_4_ = 0xb00;
  local_40 = 0x8000000a;
  fprintf(_stderr,"%s:%d: ",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d.cpp"
          ,0x311);
  __stream = _stderr;
  pcVar1 = dbgsprint(0x8000000a);
  fprintf(__stream,"%s\n",pcVar1);
  setError((Error *)((long)&in + 4));
  return 0;
}

Assistant:

bool32
rasterFromImage(Raster *raster, Image *image)
{
	if((raster->type&0xF) != Raster::TEXTURE)
		return 0;

	void (*conv)(uint8 *out, uint8 *in) = nil;

	// Unpalettize image if necessary but don't change original
	Image *truecolimg = nil;
	if(image->depth <= 8 && !isP8supported){
		truecolimg = Image::create(image->width, image->height, image->depth);
		truecolimg->pixels = image->pixels;
		truecolimg->stride = image->stride;
		truecolimg->palette = image->palette;
		truecolimg->unpalettize();
		image = truecolimg;
	}

	D3dRaster *natras = GETD3DRASTEREXT(raster);
	int32 format = raster->format&(Raster::PAL8 | Raster::PAL4 | 0xF00);
	switch(image->depth){
	case 32:
		if(format == Raster::C8888)
			conv = conv_BGRA8888_from_RGBA8888;
		else if(format == Raster::C888)
			conv = conv_BGR888_from_RGB888;
		else
			goto err;
		break;
	case 24:
		if(format == Raster::C8888)
			conv = conv_BGRA8888_from_RGB888;
		else if(format == Raster::C888)
			conv = conv_BGR888_from_RGB888;
		else
			goto err;
		break;
	case 16:
		if(format == Raster::C1555)
			conv = conv_ARGB1555_from_ARGB1555;
		else
			goto err;
		break;
	case 8:
		if(format == (Raster::PAL8 | Raster::C8888))
			conv = conv_8_from_8;
		else
			goto err;
		break;
	case 4:
		if(format == (Raster::PAL4 | Raster::C8888) ||
		   format == (Raster::PAL8 | Raster::C8888))
			conv = conv_8_from_8;
		else
			goto err;
		break;
	default:
	err:
fprintf(stderr, "%d %x\n", image->depth, format); fflush(stdout);
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	uint8 *in, *out;
	int pallength = 0;
	if(raster->format & Raster::PAL4)
		pallength = 16;
	else if(raster->format & Raster::PAL8)
		pallength = 256;
	if(pallength){
		in = image->palette;
		out = (uint8*)natras->palette;
		for(int32 i = 0; i < pallength; i++){
			conv_RGBA8888_from_RGBA8888(out, in);
			in += 4;
			out += 4;
		}
	}

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		unlock = true;
	}

	uint8 *pixels = raster->pixels;
	assert(pixels);
	uint8 *imgpixels = image->pixels;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(rasrow, imgrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels += image->stride;
		pixels += raster->stride;
	}
	if(unlock)
		raster->unlock(0);

	if(truecolimg)
		truecolimg->destroy();

	return 1;
}